

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_union_type
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,
                 flatcc_json_parser_integral_symbol_f **type_parsers,
                 flatcc_json_parser_union_f *union_parser)

{
  uint8_t *v;
  uint8_t uVar1;
  int iVar2;
  char *pcVar3;
  flatcc_builder_union_ref_t uref;
  int iVar4;
  void *pvVar5;
  long lVar6;
  char *buf_00;
  char *pcVar7;
  undefined1 auStack_37 [7];
  
  pvVar5 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  lVar6 = union_index * 0x28;
  buf_00 = buf;
  if (*(char *)((long)pvVar5 + lVar6 + 0x24) == '\0') {
    *(undefined1 *)((long)pvVar5 + lVar6 + 0x24) = 1;
    v = (uint8_t *)((long)pvVar5 + lVar6 + 0x25);
    buf_00 = flatcc_json_parser_uint8(ctx,buf,end,v);
    if (buf_00 == buf) {
      buf_00 = flatcc_json_parser_symbolic_uint8(ctx,buf_00,end,type_parsers,v);
    }
    pcVar7 = *(char **)((long)pvVar5 + lVar6 + 0x10);
    if (pcVar7 == (char *)0x0) {
      *(long *)((long)pvVar5 + 8) = (*(long *)((long)pvVar5 + 8) + 1) - (ulong)(*v == '\0');
      return buf_00;
    }
    if (*(long *)((long)pvVar5 + 8) == 0) {
      __assert_fail("f->union_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_parser.c"
                    ,0x43b,
                    "const char *flatcc_json_parser_union_type(flatcc_json_parser_t *, const char *, const char *, size_t, flatbuffers_voffset_t, size_t, flatcc_json_parser_integral_symbol_f **, flatcc_json_parser_union_f *)"
                   );
    }
    *(long *)((long)pvVar5 + 8) = *(long *)((long)pvVar5 + 8) + -1;
    iVar2 = ctx->line;
    pcVar3 = ctx->line_start;
    ctx->line = *(int *)((long)pvVar5 + lVar6 + 0x20);
    ctx->line_start = *(char **)((long)pvVar5 + lVar6 + 0x18);
    uVar1 = *(uint8_t *)((long)pvVar5 + lVar6 + 0x25);
    pcVar7 = (*union_parser)(ctx,pcVar7,end,uVar1,(flatcc_builder_ref_t *)(auStack_37 + 3));
    if (pcVar7 == end) {
      return end;
    }
    uref._1_7_ = auStack_37;
    uref.type = uVar1;
    iVar4 = flatcc_builder_table_add_union(ctx->ctx,(uint)id,uref);
    if (iVar4 == 0) {
      ctx->line = iVar2;
      ctx->line_start = pcVar3;
      return buf_00;
    }
  }
  if (ctx->error == 0) {
    ctx->error = 0x1c;
    ctx->pos = ((int)buf_00 - *(int *)&ctx->line_start) + 1;
    ctx->error_loc = buf_00;
  }
  return end;
}

Assistant:

const char *flatcc_json_parser_union_type(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index, flatbuffers_voffset_t id,
        size_t handle,
        flatcc_json_parser_integral_symbol_f *type_parsers[],
        flatcc_json_parser_union_f *union_parser)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    flatcc_builder_union_ref_t uref;
    const char *mark;
    int line;
    const char *line_start;

    if (e->type_present) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    e->type_present = 1;
    buf = flatcc_json_parser_uint8(ctx, (mark = buf), end, &e->type);
    if (mark == buf) {
        buf = flatcc_json_parser_symbolic_uint8(ctx, buf, end, type_parsers, &e->type);
    }
    /* Only count the union if the type is not NONE. */
    if (e->backtrace == 0) {
        f->union_count += e->type != 0;
        return buf;
    }
    FLATCC_ASSERT(f->union_count);
    --f->union_count;
    /*
     * IMPORTANT: we cannot access any value in the frame or entry
     * pointer after calling union parse because it might cause the
     * stack to reallocate. We should read the frame pointer again if
     * needed - we don't but remember it if refactoring code.
     *
     * IMPORTANT 2: Do not assign buf here. We are backtracking.
     */
    line = ctx->line;
    line_start = ctx->line_start;
    ctx->line = e->line;
    ctx->line_start = e->line_start;
    uref.type = e->type;
    if (end == union_parser(ctx, e->backtrace, end, e->type, &uref.value)) {
        return end;
    }
    if (flatcc_builder_table_add_union(ctx->ctx, id, uref)) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    ctx->line = line;
    ctx->line_start = line_start;
    return buf;
}